

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fakeit.hpp
# Opt level: O2

void __thiscall
fakeit::RecordedMethodBody<unsigned_long>::MatchedInvocationHandler::MatchedInvocationHandler
          (MatchedInvocationHandler *this,Matcher *matcher,
          ActualInvocationHandler<unsigned_long> *invocationHandler)

{
  (this->super_ActualInvocationHandler<unsigned_long>).super_Destructible._vptr_Destructible =
       (_func_int **)&PTR__MatchedInvocationHandler_0012d810;
  std::__shared_ptr<fakeit::Destructible,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<fakeit::ActualInvocation<>::Matcher,void>
            ((__shared_ptr<fakeit::Destructible,(__gnu_cxx::_Lock_policy)2> *)&this->_matcher,
             matcher);
  std::__shared_ptr<fakeit::Destructible,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<fakeit::ActualInvocationHandler<unsigned_long>,void>
            ((__shared_ptr<fakeit::Destructible,(__gnu_cxx::_Lock_policy)2> *)
             &this->_invocationHandler,invocationHandler);
  return;
}

Assistant:

MatchedInvocationHandler(typename ActualInvocation<arglist...>::Matcher *matcher,
                ActualInvocationHandler<R, arglist...> *invocationHandler) :
                    _matcher{matcher}, _invocationHandler{invocationHandler} {
            }